

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O1

void __thiscall
asio::detail::op_queue<asio::detail::wait_op>::~op_queue(op_queue<asio::detail::wait_op> *this)

{
  wait_op *pwVar1;
  wait_op *pwVar2;
  func_type p_Var3;
  wait_op *tmp;
  error_code local_30;
  
  do {
    pwVar1 = this->front_;
    if (pwVar1 == (wait_op *)0x0) {
      return;
    }
    pwVar2 = (wait_op *)(pwVar1->super_operation).next_;
    this->front_ = pwVar2;
    if (pwVar2 == (wait_op *)0x0) {
      this->back_ = (wait_op *)0x0;
    }
    (pwVar1->super_operation).next_ = (scheduler_operation *)0x0;
    p_Var3 = (pwVar1->super_operation).func_;
    local_30._M_value = 0;
    local_30._M_cat = (error_category *)std::_V2::system_category();
    (*p_Var3)((void *)0x0,&pwVar1->super_operation,&local_30,0);
  } while (pwVar1 != (wait_op *)0x0);
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }